

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

mat4 * mat4_rotation_z(mat4 *__return_storage_ptr__,float theta)

{
  float a;
  float e;
  float s;
  float c;
  float theta_local;
  
  a = cosf(theta);
  e = sinf(theta);
  mat4_create(__return_storage_ptr__,a,-e,0.0,0.0,e,a,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_rotation_z(float theta) {
    float c = cosf(theta);
    float s = sinf(theta);
    return mat4_create(
            c, -s, 0.0f, 0.0f,
            s, c, 0.0f, 0.0f,
            0.0f, 0.0f, 1.0f, 0.0f,
            0.0f, 0.0f, 0.0f, 1.0f);
}